

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O2

void duckdb_brotli::BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,Command *cmds,
               size_t num_commands,ContextType literal_context_mode,MetaBlockSplit *mb)

{
  BrotliDistanceParams *pBVar1;
  BlockSplit *dist_split;
  ulong uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  HistogramDistance *pHVar8;
  HistogramLiteral *pHVar9;
  ContextType *context_modes;
  HistogramDistance *pHVar10;
  HistogramCommand *__s;
  size_t sVar11;
  uint32_t *puVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  long lVar17;
  uint16_t *puVar18;
  long lVar19;
  size_t sVar20;
  uint32_t ndirect;
  HistogramLiteral *literal_histograms;
  uint32_t uVar21;
  ulong uVar22;
  bool bVar23;
  double local_e8;
  double dist_cost;
  BrotliDistanceParams orig_params;
  BrotliDistanceParams new_params;
  
  pBVar1 = &params->dist;
  orig_params.max_distance = (params->dist).max_distance;
  orig_params.distance_postfix_bits = (params->dist).distance_postfix_bits;
  orig_params.num_direct_distance_codes = (params->dist).num_direct_distance_codes;
  orig_params.alphabet_size_max = (params->dist).alphabet_size_max;
  orig_params.alphabet_size_limit = (params->dist).alphabet_size_limit;
  new_params.max_distance = (params->dist).max_distance;
  new_params.distance_postfix_bits = (params->dist).distance_postfix_bits;
  new_params.num_direct_distance_codes = (params->dist).num_direct_distance_codes;
  new_params.alphabet_size_max = (params->dist).alphabet_size_max;
  new_params.alphabet_size_limit = (params->dist).alphabet_size_limit;
  pHVar8 = (HistogramDistance *)BrotliAllocate(m,0x890);
  uVar5 = orig_params._0_8_;
  uVar4 = orig_params.distance_postfix_bits;
  uVar3 = orig_params.num_direct_distance_codes;
  local_e8 = 1e+99;
  bVar23 = true;
  uVar7 = 0;
  for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
    uVar14 = uVar7 - 1;
    while (uVar7 = uVar14 + 1, uVar7 < 0x10) {
      ndirect = uVar7 << ((byte)uVar21 & 0x1f);
      BrotliInitDistanceParams(&new_params,uVar21,ndirect,params->large_window);
      if (ndirect == uVar3 && uVar21 == uVar4) {
        bVar23 = false;
      }
      iVar6 = ComputeDistanceCost(cmds,num_commands,&orig_params,&new_params,&dist_cost,pHVar8);
      if ((iVar6 == 0) || (local_e8 < dist_cost)) break;
      (params->dist).max_distance = new_params.max_distance;
      pBVar1->distance_postfix_bits = new_params.distance_postfix_bits;
      pBVar1->num_direct_distance_codes = new_params.num_direct_distance_codes;
      (params->dist).alphabet_size_max = new_params.alphabet_size_max;
      (params->dist).alphabet_size_limit = new_params.alphabet_size_limit;
      uVar14 = uVar7;
      local_e8 = dist_cost;
    }
    uVar7 = uVar14 >> 1;
    if (uVar14 == 0xffffffff) {
      uVar7 = 0;
    }
  }
  if ((bVar23) &&
     (ComputeDistanceCost(cmds,num_commands,&orig_params,&orig_params,&dist_cost,pHVar8),
     dist_cost < local_e8)) {
    (params->dist).max_distance = orig_params.max_distance;
    pBVar1->distance_postfix_bits = orig_params.distance_postfix_bits;
    pBVar1->num_direct_distance_codes = orig_params.num_direct_distance_codes;
    (params->dist).alphabet_size_max = orig_params.alphabet_size_max;
    (params->dist).alphabet_size_limit = orig_params.alphabet_size_limit;
  }
  BrotliFree(m,pHVar8);
  if ((uVar4 != pBVar1->distance_postfix_bits) ||
     (uVar3 != (params->dist).num_direct_distance_codes)) {
    puVar18 = &cmds->dist_prefix_;
    sVar16 = num_commands;
    while (bVar23 = sVar16 != 0, sVar16 = sVar16 - 1, bVar23) {
      if (((*(uint *)(puVar18 + -5) & 0x1ffffff) != 0) && (0x7f < puVar18[-1])) {
        uVar7 = *puVar18 & 0x3ff;
        if (uVar3 + 0x10 <= uVar7) {
          uVar7 = (uVar7 - uVar3) - 0x10;
          uVar7 = (uVar7 & ~(-1 << ((byte)uVar5 & 0x1f))) + uVar3 + 0x10 +
                  ((((uVar7 >> (uVar4 & 0x1f) & 1) != 0) + 2 << ((byte)(*puVar18 >> 10) & 0x1f)) +
                   *(uint32_t *)(puVar18 + -3) + -4 << ((byte)uVar5 & 0x1f));
        }
        uVar22 = (ulong)uVar7;
        uVar15 = (ulong)(params->dist).num_direct_distance_codes;
        uVar2 = uVar15 + 0x10;
        if (uVar22 < uVar2) {
          uVar21 = 0;
        }
        else {
          bVar13 = (byte)pBVar1->distance_postfix_bits;
          uVar15 = ((4L << (bVar13 & 0x3f)) + (uVar22 - uVar15)) - 0x10;
          uVar7 = 0x1f;
          uVar14 = (uint)uVar15;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
          bVar23 = (uVar15 >> ((ulong)uVar7 & 0x3f) & 1) != 0;
          iVar6 = uVar7 - pBVar1->distance_postfix_bits;
          uVar22 = (ulong)(((uint)bVar23 + iVar6 * 2 + 0xfffe << (bVar13 & 0x3f)) +
                           (int)uVar2 + (~(-1 << (bVar13 & 0x1f)) & uVar14) | iVar6 * 0x400);
          uVar21 = (uint32_t)
                   (uVar15 - ((ulong)bVar23 + 2 << ((byte)uVar7 & 0x3f)) >> (bVar13 & 0x3f));
        }
        *puVar18 = (ushort)uVar22;
        *(uint32_t *)(puVar18 + -3) = uVar21;
      }
      puVar18 = puVar18 + 8;
    }
  }
  dist_split = &mb->distance_split;
  BrotliSplitBlock(m,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                   &mb->command_split,dist_split);
  sVar16 = (mb->literal_split).num_types;
  if (params->disable_literal_context_modeling == 0) {
    if (sVar16 == 0) {
      sVar16 = 0;
      context_modes = (ContextType *)0x0;
    }
    else {
      context_modes = (ContextType *)BrotliAllocate(m,sVar16 << 2);
      sVar16 = (mb->literal_split).num_types;
    }
    lVar19 = 0x40;
    for (sVar20 = 0; sVar16 != sVar20; sVar20 = sVar20 + 1) {
      context_modes[sVar20] = literal_context_mode;
    }
  }
  else {
    context_modes = (ContextType *)0x0;
    lVar19 = 1;
  }
  sVar16 = sVar16 * lVar19;
  sVar20 = sVar16;
  if (sVar16 == 0) {
    pHVar9 = (HistogramLiteral *)0x0;
    literal_histograms = pHVar9;
  }
  else {
    pHVar9 = (HistogramLiteral *)BrotliAllocate(m,sVar16 * 0x410);
    literal_histograms = pHVar9;
  }
  while (sVar20 != 0) {
    switchD_016d8eb1::default(pHVar9,0,0x408);
    pHVar9->bit_cost_ = INFINITY;
    pHVar9 = pHVar9 + 1;
    sVar20 = sVar20 - 1;
  }
  lVar19 = dist_split->num_types * 4;
  if (lVar19 == 0) {
    pHVar10 = (HistogramDistance *)0x0;
    pHVar8 = pHVar10;
  }
  else {
    pHVar10 = (HistogramDistance *)BrotliAllocate(m,dist_split->num_types * 0x2240);
    pHVar8 = pHVar10;
  }
  while (bVar23 = lVar19 != 0, lVar19 = lVar19 + -1, bVar23) {
    switchD_016d8eb1::default(pHVar10,0,0x888);
    pHVar10->bit_cost_ = INFINITY;
    pHVar10 = pHVar10 + 1;
  }
  sVar20 = (mb->command_split).num_types;
  mb->command_histograms_size = sVar20;
  if (sVar20 == 0) {
    sVar20 = 0;
    __s = (HistogramCommand *)0x0;
  }
  else {
    __s = (HistogramCommand *)BrotliAllocate(m,sVar20 * 0xb10);
    sVar20 = mb->command_histograms_size;
  }
  mb->command_histograms = __s;
  while (bVar23 = sVar20 != 0, sVar20 = sVar20 - 1, bVar23) {
    switchD_016d8eb1::default(__s,0,0xb08);
    __s->bit_cost_ = INFINITY;
    __s = __s + 1;
  }
  BrotliBuildHistogramsWithContext
            (cmds,num_commands,&mb->literal_split,&mb->command_split,dist_split,ringbuffer,pos,mask,
             prev_byte,prev_byte2,context_modes,literal_histograms,mb->command_histograms,pHVar8);
  BrotliFree(m,context_modes);
  sVar20 = (mb->literal_split).num_types;
  sVar11 = sVar20 << 6;
  mb->literal_context_map_size = sVar11;
  if (sVar11 == 0) {
    mb->literal_context_map = (uint32_t *)0x0;
    mb->literal_histograms_size = 0;
    puVar12 = (uint32_t *)0x0;
  }
  else {
    puVar12 = (uint32_t *)BrotliAllocate(m,sVar20 << 8);
    sVar20 = mb->literal_context_map_size;
    mb->literal_context_map = puVar12;
    mb->literal_histograms_size = sVar20;
    if (sVar20 != 0) {
      pHVar9 = (HistogramLiteral *)BrotliAllocate(m,sVar20 * 0x410);
      puVar12 = mb->literal_context_map;
      goto LAB_01f57378;
    }
  }
  pHVar9 = (HistogramLiteral *)0x0;
LAB_01f57378:
  mb->literal_histograms = pHVar9;
  BrotliClusterHistogramsLiteral
            (m,literal_histograms,sVar16,0x100,pHVar9,&mb->literal_histograms_size,puVar12);
  BrotliFree(m,literal_histograms);
  if (params->disable_literal_context_modeling != 0) {
    sVar16 = (mb->literal_split).num_types;
    lVar19 = sVar16 << 8;
    while (bVar23 = sVar16 != 0, sVar16 = sVar16 - 1, bVar23) {
      puVar12 = mb->literal_context_map;
      for (lVar17 = -0x100; lVar17 != 0; lVar17 = lVar17 + 4) {
        *(uint32_t *)((long)puVar12 + lVar17 + lVar19) = puVar12[sVar16];
      }
      lVar19 = lVar19 + -0x100;
    }
  }
  sVar20 = (mb->distance_split).num_types;
  sVar16 = sVar20 * 4;
  mb->distance_context_map_size = sVar16;
  if (sVar16 == 0) {
    mb->distance_context_map = (uint32_t *)0x0;
    mb->distance_histograms_size = 0;
    puVar12 = (uint32_t *)0x0;
    sVar16 = 0;
    pHVar10 = (HistogramDistance *)0x0;
  }
  else {
    puVar12 = (uint32_t *)BrotliAllocate(m,sVar20 << 4);
    sVar16 = mb->distance_context_map_size;
    mb->distance_context_map = puVar12;
    mb->distance_histograms_size = sVar16;
    if (sVar16 == 0) {
      sVar16 = 0;
      pHVar10 = (HistogramDistance *)0x0;
    }
    else {
      pHVar10 = (HistogramDistance *)BrotliAllocate(m,sVar16 * 0x890);
      puVar12 = mb->distance_context_map;
      sVar16 = mb->distance_context_map_size;
    }
  }
  mb->distance_histograms = pHVar10;
  BrotliClusterHistogramsDistance
            (m,pHVar8,sVar16,0x100,pHVar10,&mb->distance_histograms_size,puVar12);
  BrotliFree(m,pHVar8);
  return;
}

Assistant:

void duckdb_brotli::BrotliBuildMetaBlock(MemoryManager* m,
                          const uint8_t* ringbuffer,
                          const size_t pos,
                          const size_t mask,
                          BrotliEncoderParams* params,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          Command* cmds,
                          size_t num_commands,
                          ContextType literal_context_mode,
                          MetaBlockSplit* mb) {
  /* Histogram ids need to fit in one byte. */
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliDistanceParams orig_params = params->dist;
  BrotliDistanceParams new_params = params->dist;
  HistogramDistance* tmp = BROTLI_ALLOC(m, HistogramDistance, 1);

  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(tmp)) return;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect,
                               params->large_window);
      if (npostfix == orig_params.distance_postfix_bits &&
          ndirect == orig_params.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands, &orig_params, &new_params, &dist_cost, tmp);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands, &orig_params, &orig_params,
                        &dist_cost, tmp);
    if (dist_cost < best_dist_cost) {
      /* NB: currently unused; uncomment when more param tuning is added. */
      /* best_dist_cost = dist_cost; */
      params->dist = orig_params;
    }
  }
  BROTLI_FREE(m, tmp);
  RecomputeDistancePrefixes(cmds, num_commands, &orig_params, &params->dist);

  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split);
  if (BROTLI_IS_OOM(m)) return;

  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_context_modes)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }

  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_histograms)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_histograms)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);

  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->command_histograms)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);

  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);

  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_context_map)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_histograms)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }

  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_context_map)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_histograms)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}